

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O1

int annMaxSpread(ANNpointArray pa,ANNidxArray pidx,int n,int dim)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  ANNcoord AVar7;
  double dVar8;
  ANNcoord AVar9;
  
  iVar2 = 0;
  if (0 < dim && n != 0) {
    uVar4 = 0;
    dVar6 = 0.0;
    uVar3 = 0;
    do {
      AVar7 = pa[*pidx][uVar4];
      dVar8 = AVar7;
      if (1 < n) {
        uVar5 = 1;
        AVar9 = AVar7;
        do {
          dVar1 = pa[pidx[uVar5]][uVar4];
          dVar8 = dVar1;
          if ((AVar9 <= dVar1) && (dVar8 = AVar9, AVar7 < dVar1)) {
            AVar7 = dVar1;
          }
          uVar5 = uVar5 + 1;
          AVar9 = dVar8;
        } while ((uint)n != uVar5);
      }
      dVar8 = AVar7 - dVar8;
      if (dVar6 < dVar8) {
        uVar3 = uVar4 & 0xffffffff;
      }
      iVar2 = (int)uVar3;
      if (dVar8 <= dVar6) {
        dVar8 = dVar6;
      }
      dVar6 = dVar8;
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)dim);
  }
  return iVar2;
}

Assistant:

int annMaxSpread(      // compute dimension of max spread
    ANNpointArray pa,  // point array
    ANNidxArray pidx,  // point indices
    int n,             // number of points
    int dim)           // dimension of space
{
    int max_dim = 0;       // dimension of max spread
    ANNcoord max_spr = 0;  // amount of max spread

    if (n == 0) return max_dim;  // no points, who cares?

    for (int d = 0; d < dim; d++) {  // compute spread along each dim
        ANNcoord spr = annSpread(pa, pidx, n, d);
        if (spr > max_spr) {  // bigger than current max
            max_spr = spr;
            max_dim = d;
        }
    }
    return max_dim;
}